

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

int google::protobuf::compiler::cpp::EstimateAlignmentSize(FieldDescriptor *field)

{
  int iVar1;
  LogMessage *other;
  FieldDescriptor *local_48;
  code *local_40 [7];
  
  if (field == (FieldDescriptor *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 8;
    if ((~(byte)field[1] & 0x60) != 0) {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_40[0] = FieldDescriptor::TypeOnceInit;
        local_48 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),local_40,&local_48);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) - 1U < 10) {
        iVar1 = *(int *)(&DAT_003e531c +
                        (ulong)(*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                        (ulong)(byte)field[2] * 4) - 1U) * 4);
      }
      else {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_40,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
                   ,0x1f1);
        other = internal::LogMessage::operator<<((LogMessage *)local_40,"Can\'t get here.");
        internal::LogFinisher::operator=((LogFinisher *)&local_48,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_40);
        iVar1 = -1;
      }
    }
  }
  return iVar1;
}

Assistant:

int EstimateAlignmentSize(const FieldDescriptor* field) {
  if (field == nullptr) return 0;
  if (field->is_repeated()) return 8;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return 1;

    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_FLOAT:
      return 4;

    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return 8;
  }
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return -1;  // Make compiler happy.
}